

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O1

int Fxch_ManDivSingleCube(Fxch_Man_t *pFxchMan,int iCube,int fAdd,int fUpdate)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *p;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  long local_58;
  
  if ((iCube < 0) || (pFxchMan->vCubes->nSize <= iCube)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  pVVar3 = pFxchMan->vCubes->pArray;
  uVar4 = (ulong)(uint)iCube;
  lVar5 = uVar4 * 0x10;
  if ((1 < pVVar3[uVar4].nSize) && (1 < pVVar3[uVar4].nSize)) {
    local_58 = 2;
    lVar8 = 1;
    do {
      lVar5 = lVar8 + 1;
      if (lVar5 < pVVar3[uVar4].nSize) {
        iVar1 = pVVar3[uVar4].pArray[lVar8];
        lVar8 = local_58;
        do {
          iVar11 = pVVar3[uVar4].pArray[lVar8];
          if (iVar11 <= iVar1) {
            __assert_fail("Lit0 < Lit1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxch/FxchMan.c"
                          ,0x47,"int Fxch_ManDivSingleCube(Fxch_Man_t *, int, int, int)");
          }
          p = pFxchMan->vCubeFree;
          p->nSize = 0;
          if ((iVar1 < 0) || (Vec_IntPush(p,iVar1 * 2 ^ 2), iVar11 < 0)) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x131,"int Abc_LitNot(int)");
          }
          Vec_IntPush(pFxchMan->vCubeFree,iVar11 * 2 ^ 3);
          uVar2 = pFxchMan->nSizeOutputID;
          uVar6 = uVar2 * iCube;
          if (((int)uVar6 < 0) || (pFxchMan->vOutputID->nSize <= (int)uVar6)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          if ((int)uVar2 < 1) {
            iVar11 = 0;
          }
          else {
            uVar7 = 0;
            iVar11 = 0;
            do {
              uVar10 = pFxchMan->vOutputID->pArray[uVar6 + uVar7];
              uVar10 = (uVar10 >> 1 & 0x55555555) + (uVar10 & 0x55555555);
              uVar10 = (uVar10 >> 2 & 0x33333333) + (uVar10 & 0x33333333);
              uVar10 = (uVar10 >> 4 & 0x7070707) + (uVar10 & 0x7070707);
              uVar10 = (uVar10 >> 8 & 0xf000f) + (uVar10 & 0xf000f);
              iVar11 = (uVar10 >> 0x10) + iVar11 + (uVar10 & 0xffff);
              uVar7 = uVar7 + 1;
            } while (uVar2 != uVar7);
          }
          iVar11 = iVar11 + (uint)(iVar11 == 0);
          if (fAdd == 0) {
            do {
              Fxch_DivRemove(pFxchMan,fUpdate,1,0);
              iVar11 = iVar11 + -1;
            } while (iVar11 != 0);
            iVar9 = -1;
          }
          else {
            do {
              iVar9 = 1;
              Fxch_DivAdd(pFxchMan,fUpdate,1,0);
              iVar11 = iVar11 + -1;
            } while (iVar11 != 0);
          }
          pFxchMan->nPairsS = pFxchMan->nPairsS + iVar9;
          lVar8 = lVar8 + 1;
        } while ((int)lVar8 < pVVar3[uVar4].nSize);
      }
      local_58 = local_58 + 1;
      lVar8 = lVar5;
    } while (lVar5 < pVVar3[uVar4].nSize);
  }
  return (int)lVar5;
}

Assistant:

static inline int Fxch_ManDivSingleCube( Fxch_Man_t* pFxchMan,
                                         int iCube,
                                         int fAdd,
                                         int fUpdate )
{
    Vec_Int_t* vCube = Vec_WecEntry( pFxchMan->vCubes, iCube );
    int i, k,
        Lit0,
        Lit1,
        fSingleCube = 1,
        fBase = 0;

    if ( Vec_IntSize( vCube ) < 2 )
        return 0;

    Vec_IntForEachEntryStart( vCube, Lit0, i, 1)
    Vec_IntForEachEntryStart( vCube, Lit1, k, (i + 1) )
    {
        int * pOutputID, nOnes, j, z;
        assert( Lit0 < Lit1 );

        Vec_IntClear( pFxchMan->vCubeFree );
        Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( Abc_LitNot( Lit0 ), 0 ) );
        Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( Abc_LitNot( Lit1 ), 1 ) );

        pOutputID = Vec_IntEntryP( pFxchMan->vOutputID, iCube * pFxchMan->nSizeOutputID );
        nOnes = 0;

        for ( j = 0; j < pFxchMan->nSizeOutputID; j++ )
            nOnes += Fxch_CountOnes( pOutputID[j] );

        if ( nOnes == 0 )
            nOnes = 1;

        if (fAdd)
        {
            for ( z = 0; z < nOnes; z++ )
                Fxch_DivAdd( pFxchMan, fUpdate, fSingleCube, fBase );
            pFxchMan->nPairsS++;
        }
        else
        {
            for ( z = 0; z < nOnes; z++ )
                Fxch_DivRemove( pFxchMan, fUpdate, fSingleCube, fBase );
            pFxchMan->nPairsS--;
        }
    }

    return Vec_IntSize( vCube ) * ( Vec_IntSize( vCube ) - 1 ) / 2;
}